

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

int cpu_ldsw_data_mips64(CPUArchState_conflict10 *env,target_ulong ptr)

{
  int iVar1;
  target_ulong ptr_local;
  CPUArchState_conflict10 *env_local;
  
  iVar1 = cpu_ldsw_data_ra_mips64(env,ptr,0);
  return iVar1;
}

Assistant:

int cpu_ldsw_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldsw_data_ra(env, ptr, 0);
}